

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O2

QString * CPP::WriteInitialization::domColor2QString(QString *__return_storage_ptr__,DomColor *c)

{
  storage_type *psVar1;
  QArrayDataPointer<char16_t> *this;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QArrayDataPointer<char16_t> QStack_98;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  this = &QStack_98;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (c->m_has_attr_alpha == true) {
    psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("QColor(%1, %2, %3, %4)",0x17);
    QVar2.m_data = psVar1;
    QVar2.m_size = (qsizetype)&QStack_98;
    QString::fromLatin1(QVar2);
    QString::arg<int,_true>((QString *)&local_80,(QString *)&QStack_98,c->m_red,0,10,(QChar)0x20);
    QString::arg<int,_true>((QString *)&local_68,(QString *)&local_80,c->m_green,0,10,(QChar)0x20);
    QString::arg<int,_true>((QString *)&local_50,(QString *)&local_68,c->m_blue,0,10,(QChar)0x20);
    QString::arg<int,_true>
              (__return_storage_ptr__,(QString *)&local_50,c->m_attr_alpha,0,10,(QChar)0x20);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  }
  else {
    psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("QColor(%1, %2, %3)",0x13);
    QVar3.m_data = psVar1;
    QVar3.m_size = (qsizetype)&local_80;
    QString::fromLatin1(QVar3);
    QString::arg<int,_true>((QString *)&local_68,(QString *)&local_80,c->m_red,0,10,(QChar)0x20);
    QString::arg<int,_true>((QString *)&local_50,(QString *)&local_68,c->m_green,0,10,(QChar)0x20);
    QString::arg<int,_true>(__return_storage_ptr__,(QString *)&local_50,c->m_blue,0,10,(QChar)0x20);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    this = &local_80;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString WriteInitialization::domColor2QString(const DomColor *c)
{
    if (c->hasAttributeAlpha())
        return QString::fromLatin1("QColor(%1, %2, %3, %4)")
            .arg(c->elementRed())
            .arg(c->elementGreen())
            .arg(c->elementBlue())
            .arg(c->attributeAlpha());
    return QString::fromLatin1("QColor(%1, %2, %3)")
        .arg(c->elementRed())
        .arg(c->elementGreen())
        .arg(c->elementBlue());
}